

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O2

int lfreepool(lua_State *L)

{
  undefined1 auVar1 [16];
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  
  pvVar3 = lua_touserdata(L,1);
  sVar4 = lua_rawlen(L,1);
  lVar6 = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar4;
  uVar2 = SUB164(auVar1 / ZEXT816(0x18),0);
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  for (; uVar5 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
    if (*(void **)((long)pvVar3 + lVar6) != (void *)0x0) {
      free(*(void **)((long)pvVar3 + lVar6));
      *(undefined8 *)((long)pvVar3 + lVar6) = 0;
    }
  }
  return 0;
}

Assistant:

static int
lfreepool(lua_State *L) {
	struct buffer_node * pool = lua_touserdata(L, 1);
	int sz = lua_rawlen(L,1) / sizeof(*pool);
	int i;
	for (i=0;i<sz;i++) {
		struct buffer_node *node = &pool[i];
		if (node->msg) {
			skynet_free(node->msg);
			node->msg = NULL;
		}
	}
	return 0;
}